

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void print_set_debug(lyxp_set *set)

{
  longdouble lVar1;
  lyxp_node_type lVar2;
  uint uVar3;
  LYS_NODE LVar4;
  lys_node *plVar5;
  int iVar6;
  lyxp_set_node *plVar7;
  ulong uVar8;
  char *format;
  char *pcVar9;
  lyd_node *plVar10;
  lyd_node *plVar11;
  ulong uVar12;
  long local_68;
  ushort uStack_60;
  char *local_40;
  char *str_num;
  
  if (ly_log_level < 3) {
    return;
  }
  switch(set->type) {
  case LYXP_SET_EMPTY:
    ly_log_dbg(8,"set EMPTY");
    return;
  case LYXP_SET_NODE_SET:
    ly_log_dbg(8,"set NODE SET:");
    uVar12 = 0;
LAB_00173047:
    while( true ) {
      if (set->used <= uVar12) {
        return;
      }
      lVar2 = (set->val).nodes[uVar12].type;
      if (lVar2 < (LYXP_NODE_ATTR|LYXP_NODE_ROOT_CONFIG)) break;
      uVar12 = uVar12 + 1;
    }
    plVar7 = (set->val).nodes + uVar12;
    switch(lVar2) {
    case LYXP_NODE_ROOT:
      uVar3 = plVar7->pos;
      pcVar9 = "\t%d (pos %u): ROOT";
      break;
    case LYXP_NODE_ROOT_CONFIG:
      uVar3 = plVar7->pos;
      pcVar9 = "\t%d (pos %u): ROOT CONFIG";
      break;
    case LYXP_NODE_ELEM:
      plVar11 = plVar7->node;
      plVar5 = plVar11->schema;
      if (plVar5->nodetype == LYS_LEAFLIST) {
        uVar8 = (ulong)plVar7->pos;
        plVar10 = (lyd_node *)plVar5->name;
        plVar11 = (lyd_node *)plVar11->ht;
        pcVar9 = "\t%d (pos %u): ELEM %s (val: %s)";
      }
      else {
        if ((plVar5->nodetype != LYS_LIST) || (plVar11->child->schema->nodetype != LYS_LEAF)) {
          uVar8 = (ulong)plVar7->pos;
          pcVar9 = plVar5->name;
          format = "\t%d (pos %u): ELEM %s";
          goto LAB_0017316e;
        }
        uVar8 = (ulong)plVar7->pos;
        plVar10 = (lyd_node *)plVar5->name;
        plVar11 = (lyd_node *)plVar11->child->ht;
        pcVar9 = "\t%d (pos %u): ELEM %s (1st child val: %s)";
      }
      goto LAB_00173194;
    case LYXP_NODE_TEXT:
      LVar4 = plVar7->node->schema->nodetype;
      uVar8 = (ulong)plVar7->pos;
      if ((LVar4 & LYS_ANYDATA) == LYS_UNKNOWN) {
        pcVar9 = (char *)plVar7->node->ht;
        format = "\t%d (pos %u): TEXT %s";
      }
      else {
        pcVar9 = "anydata";
        if (LVar4 == LYS_ANYXML) {
          pcVar9 = "anyxml";
        }
        format = "\t%d (pos %u): TEXT <%s>";
      }
LAB_0017316e:
      uVar12 = uVar12 + 1;
      ly_log_dbg(8,format,uVar12 & 0xffffffff,uVar8,pcVar9);
      goto LAB_00173047;
    case LYXP_NODE_ATTR:
      uVar8 = (ulong)plVar7->pos;
      plVar10 = plVar7->node->next;
      plVar11 = plVar7->node->parent;
      pcVar9 = "\t%d (pos %u): ATTR %s = %s";
LAB_00173194:
      uVar12 = uVar12 + 1;
      ly_log_dbg(8,pcVar9,uVar12 & 0xffffffff,uVar8,plVar10,plVar11);
      goto LAB_00173047;
    }
    uVar12 = uVar12 + 1;
    ly_log_dbg(8,pcVar9,uVar12 & 0xffffffff,(ulong)uVar3);
    goto LAB_00173047;
  case LYXP_SET_SNODE_SET:
    ly_log_dbg(8,"set SNODE SET:");
    uVar12 = 0;
    do {
      while( true ) {
        while( true ) {
          if (set->used <= uVar12) {
            return;
          }
          plVar7 = (set->val).nodes + uVar12;
          lVar2 = (set->val).nodes[uVar12].type;
          if (lVar2 != LYXP_NODE_ELEM) break;
          uVar12 = uVar12 + 1;
          ly_log_dbg(8,"\t%d (%u): ELEM %s",uVar12 & 0xffffffff,(ulong)plVar7->pos,
                     plVar7->node->schema);
        }
        if (lVar2 != LYXP_NODE_ROOT_CONFIG) break;
        uVar3 = plVar7->pos;
        pcVar9 = "\t%d (%u): ROOT CONFIG";
LAB_00172f9d:
        uVar12 = uVar12 + 1;
        ly_log_dbg(8,pcVar9,uVar12 & 0xffffffff,(ulong)uVar3);
      }
      if (lVar2 == LYXP_NODE_ROOT) {
        uVar3 = plVar7->pos;
        pcVar9 = "\t%d (%u): ROOT";
        goto LAB_00172f9d;
      }
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
             ,0x107);
      uVar12 = uVar12 + 1;
    } while( true );
  case LYXP_SET_BOOLEAN:
    ly_log_dbg(8,"set BOOLEAN");
    pcVar9 = "true";
    if ((set->val).bool == 0) {
      pcVar9 = "false";
    }
    break;
  case LYXP_SET_NUMBER:
    ly_log_dbg(8,"set NUMBER");
    lVar1 = (set->val).num;
    if (NAN(lVar1)) {
      pcVar9 = "NaN";
LAB_0017324a:
      local_40 = strdup(pcVar9);
LAB_00173253:
      if (local_40 != (char *)0x0) {
        ly_log_dbg(8,"\t%s",local_40);
        free(local_40);
        return;
      }
    }
    else {
      if ((lVar1 == (longdouble)0) && (!NAN(lVar1) && !NAN((longdouble)0))) {
        pcVar9 = "0";
        goto LAB_0017324a;
      }
      local_68 = SUB108(lVar1,0);
      uStack_60 = (ushort)((unkuint10)lVar1 >> 0x40);
      if (-1 < (short)uStack_60 && ((~uStack_60 & 0x7fff) == 0 && local_68 == -0x8000000000000000))
      {
        pcVar9 = "Infinity";
        goto LAB_0017324a;
      }
      if (((~uStack_60 & 0x7fff) == 0 && local_68 == -0x8000000000000000) && (short)uStack_60 < 0) {
        pcVar9 = "-Infinity";
        goto LAB_0017324a;
      }
      if ((lVar1 != (longdouble)(long)ROUND(lVar1)) ||
         (NAN(lVar1) || NAN((longdouble)(long)ROUND(lVar1)))) {
        iVar6 = asprintf(&local_40,"%03.1Lf");
      }
      else {
        iVar6 = asprintf(&local_40,"%lld");
      }
      if (iVar6 != -1) goto LAB_00173253;
      local_40 = (char *)0x0;
    }
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","print_set_debug");
switchD_00172ecc_default:
    return;
  case LYXP_SET_STRING:
    ly_log_dbg(8,"set STRING");
    pcVar9 = (char *)(set->val).nodes;
    break;
  default:
    goto switchD_00172ecc_default;
  }
  ly_log_dbg(8,"\t%s",pcVar9);
  return;
}

Assistant:

static void
print_set_debug(struct lyxp_set *set)
{
    uint32_t i;
    char *str_num;
    struct lyxp_set_node *item;
    struct lyxp_set_snode *sitem;

    if (ly_log_level < LY_LLDBG) {
        return;
    }

    switch (set->type) {
    case LYXP_SET_NODE_SET:
        LOGDBG(LY_LDGXPATH, "set NODE SET:");
        for (i = 0; i < set->used; ++i) {
            item = &set->val.nodes[i];

            switch (item->type) {
            case LYXP_NODE_ROOT:
                LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ROOT", i + 1, item->pos);
                break;
            case LYXP_NODE_ROOT_CONFIG:
                LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ROOT CONFIG", i + 1, item->pos);
                break;
            case LYXP_NODE_ELEM:
                if ((item->node->schema->nodetype == LYS_LIST)
                        && (item->node->child->schema->nodetype == LYS_LEAF)) {
                    LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ELEM %s (1st child val: %s)", i + 1, item->pos,
                           item->node->schema->name,
                           ((struct lyd_node_leaf_list *)item->node->child)->value_str);
                } else if (item->node->schema->nodetype == LYS_LEAFLIST) {
                    LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ELEM %s (val: %s)", i + 1, item->pos,
                           item->node->schema->name,
                           ((struct lyd_node_leaf_list *)item->node)->value_str);
                } else {
                    LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ELEM %s", i + 1, item->pos, item->node->schema->name);
                }
                break;
            case LYXP_NODE_TEXT:
                if (item->node->schema->nodetype & LYS_ANYDATA) {
                    LOGDBG(LY_LDGXPATH, "\t%d (pos %u): TEXT <%s>", i + 1, item->pos,
                           item->node->schema->nodetype == LYS_ANYXML ? "anyxml" : "anydata");
                } else {
                    LOGDBG(LY_LDGXPATH, "\t%d (pos %u): TEXT %s", i + 1, item->pos,
                           ((struct lyd_node_leaf_list *)item->node)->value_str);
                }
                break;
            case LYXP_NODE_ATTR:
                LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ATTR %s = %s", i + 1, item->pos, set->val.attrs[i].attr->name,
                       set->val.attrs[i].attr->value);
                break;
            }
        }
        break;

    case LYXP_SET_SNODE_SET:
        LOGDBG(LY_LDGXPATH, "set SNODE SET:");
        for (i = 0; i < set->used; ++i) {
            sitem = &set->val.snodes[i];

            switch (sitem->type) {
            case LYXP_NODE_ROOT:
                LOGDBG(LY_LDGXPATH, "\t%d (%u): ROOT", i + 1, sitem->in_ctx);
                break;
            case LYXP_NODE_ROOT_CONFIG:
                LOGDBG(LY_LDGXPATH, "\t%d (%u): ROOT CONFIG", i + 1, sitem->in_ctx);
                break;
            case LYXP_NODE_ELEM:
                LOGDBG(LY_LDGXPATH, "\t%d (%u): ELEM %s", i + 1, sitem->in_ctx, sitem->snode->name);
                break;
            default:
                LOGINT(NULL);
                break;
            }
        }
        break;

    case LYXP_SET_EMPTY:
        LOGDBG(LY_LDGXPATH, "set EMPTY");
        break;

    case LYXP_SET_BOOLEAN:
        LOGDBG(LY_LDGXPATH, "set BOOLEAN");
        LOGDBG(LY_LDGXPATH, "\t%s", (set->val.bool ? "true" : "false"));
        break;

    case LYXP_SET_STRING:
        LOGDBG(LY_LDGXPATH, "set STRING");
        LOGDBG(LY_LDGXPATH, "\t%s", set->val.str);
        break;

    case LYXP_SET_NUMBER:
        LOGDBG(LY_LDGXPATH, "set NUMBER");

        if (isnan(set->val.num)) {
            str_num = strdup("NaN");
        } else if ((set->val.num == 0) || (set->val.num == -0.0f)) {
            str_num = strdup("0");
        } else if (isinf(set->val.num) && !signbit(set->val.num)) {
            str_num = strdup("Infinity");
        } else if (isinf(set->val.num) && signbit(set->val.num)) {
            str_num = strdup("-Infinity");
        } else if ((long long)set->val.num == set->val.num) {
            if (asprintf(&str_num, "%lld", (long long)set->val.num) == -1) {
                str_num = NULL;
            }
        } else {
            if (asprintf(&str_num, "%03.1Lf", set->val.num) == -1) {
                str_num = NULL;
            }
        }
        LY_CHECK_ERR_RETURN(!str_num, LOGMEM(NULL), );

        LOGDBG(LY_LDGXPATH, "\t%s", str_num);
        free(str_num);
    }
}